

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

CWire * __thiscall CSegment::Pupate(CSegment *this)

{
  int iVar1;
  int iVar2;
  int iX2;
  int iY2;
  int iZ;
  CWire *this_00;
  CWire *pWire;
  CSegment *this_local;
  
  this_00 = CWire::New();
  if (this_00 == (CWire *)0x0) {
    __assert_fail("pWire",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Segment.cpp"
                  ,0xfb,"CWire *CSegment::Pupate()");
  }
  iVar1 = CPoint::Z(this->m_pPointS);
  iVar2 = CPoint::Z(this->m_pPointE);
  if (iVar1 == iVar2) {
    iVar1 = CPoint::X(this->m_pPointS);
    iVar2 = CPoint::Y(this->m_pPointS);
    iX2 = CPoint::X(this->m_pPointE);
    iY2 = CPoint::Y(this->m_pPointE);
    iZ = CPoint::Z(this->m_pPointS);
    CWire::Initialize(this_00,iVar1,iVar2,iX2,iY2,iZ);
    return this_00;
  }
  __assert_fail("m_pPointS->Z()==m_pPointE->Z()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Segment.cpp"
                ,0xfc,"CWire *CSegment::Pupate()");
}

Assistant:

CWire* CSegment::Pupate()
{
	CWire*	pWire	=	CWire::New();//new	CWire;

	assert(pWire);
	assert(m_pPointS->Z()==m_pPointE->Z());

	pWire->Initialize(m_pPointS->X(),m_pPointS->Y(),m_pPointE->X(),m_pPointE->Y(),m_pPointS->Z());

	// this will be deleted by CWire [6/30/2006 thyeros]
	return	pWire;
}